

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphOptimizations.cpp
# Opt level: O0

uint __thiscall dg::pta::PSNoopRemover::run(PSNoopRemover *this)

{
  bool bVar1;
  PSNodeType PVar2;
  pointer this_00;
  undefined8 *in_RDI;
  unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *nd;
  const_iterator __end2;
  const_iterator __begin2;
  NodesT *__range2;
  uint removed;
  PSNode *in_stack_ffffffffffffffb8;
  PointerGraph *in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
  local_20;
  NodesT *local_18;
  uint local_c;
  
  local_c = 0;
  local_18 = PointerGraph::getNodes((PointerGraph *)*in_RDI);
  local_20._M_current =
       (unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
       std::
       vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
       ::begin((vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                *)in_stack_ffffffffffffffb8);
  std::
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  ::end((vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
         *)in_stack_ffffffffffffffb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
                             *)in_stack_ffffffffffffffc0,
                            (__normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
                             *)in_stack_ffffffffffffffb8), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
    ::operator*(&local_20);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
                       0x15d5d4);
    if (bVar1) {
      this_00 = std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::operator->
                          ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
                           0x15d5e4);
      PVar2 = PSNode::getType(this_00);
      if (PVar2 == NOOP) {
        in_stack_ffffffffffffffc0 = (PointerGraph *)*in_RDI;
        std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::get
                  ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)0x15d608);
        removeNode(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        local_c = local_c + 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
    ::operator++(&local_20);
  }
  return local_c;
}

Assistant:

unsigned PSNoopRemover::run() {
    unsigned removed = 0;
    for (const auto &nd : G->getNodes()) {
        if (!nd)
            continue;

        if (nd->getType() == PSNodeType::NOOP) {
            // this should not break the iterator
            removeNode(G, nd.get());
            ++removed;
        }
    }
    return removed;
}